

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteBytes
               (int field_number,string *value,CodedOutputStream *output)

{
  pointer data;
  bool bVar1;
  string *psVar2;
  uint8_t *puVar3;
  string *psVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  EpsCopyOutputStream *this;
  EpsCopyOutputStream *this_00;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  undefined1 auStack_68 [16];
  CodedOutputStream *pCStack_58;
  string *psStack_50;
  ulong uStack_48;
  code *pcStack_40;
  undefined1 local_30 [16];
  
  uVar8 = field_number << 3;
  pbVar10 = output->cur_;
  if ((output->impl_).end_ <= pbVar10) {
    pcStack_40 = (code *)0x33c840;
    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar10);
  }
  uVar6 = field_number * 8 + 2;
  output->cur_ = pbVar10;
  uVar7 = uVar6;
  if (0x7f < uVar8) {
    do {
      *pbVar10 = (byte)uVar7 | 0x80;
      uVar6 = uVar7 >> 7;
      pbVar10 = pbVar10 + 1;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar6;
    } while (bVar1);
  }
  *pbVar10 = (byte)uVar6;
  output->cur_ = pbVar10 + 1;
  if ((value->_M_string_length & 0xffffffff80000000) == 0) {
    psVar2 = (string *)0x0;
  }
  else {
    pcStack_40 = (code *)0x33c856;
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (value->_M_string_length,0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar2 != (string *)0x0) {
    iVar9 = (int)local_30;
    pcStack_40 = WriteBytesMaybeAliased;
    WriteBytes();
    pbVar10 = this[1].end_;
    pCStack_58 = output;
    psStack_50 = value;
    uStack_48 = (ulong)(uint)field_number;
    pcStack_40 = (code *)(ulong)uVar8;
    if (this->end_ <= pbVar10) {
      pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar10);
    }
    uVar7 = iVar9 * 8 + 2;
    this[1].end_ = pbVar10;
    uVar8 = uVar7;
    if (0x7f < (uint)(iVar9 << 3)) {
      do {
        *pbVar10 = (byte)uVar8 | 0x80;
        uVar7 = uVar8 >> 7;
        pbVar10 = pbVar10 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar7;
      } while (bVar1);
    }
    *pbVar10 = (byte)uVar7;
    this[1].end_ = pbVar10 + 1;
    if ((*(ulong *)(psVar2 + 8) & 0xffffffff80000000) == 0) {
      psVar4 = (string *)0x0;
    }
    else {
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (*(ulong *)(psVar2 + 8),0x7fffffff,"value.size() <= kInt32MaxSize");
    }
    if (psVar4 != (string *)0x0) {
      iVar9 = (int)auStack_68;
      WriteBytesMaybeAliased();
      uVar8 = iVar9 << 3;
      pbVar10 = this_00[1].end_;
      if (this_00->end_ <= pbVar10) {
        pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_00,pbVar10);
      }
      uVar5 = (ulong)(iVar9 * 8 + 3);
      this_00[1].end_ = pbVar10;
      if (0x7f < uVar8) {
        do {
          uVar7 = (uint)uVar5;
          *pbVar10 = (byte)uVar5 | 0x80;
          uVar5 = uVar5 >> 7;
          pbVar10 = pbVar10 + 1;
        } while (0x3fff < uVar7);
      }
      *pbVar10 = (byte)uVar5;
      this_00[1].end_ = pbVar10 + 1;
      pbVar10 = (byte *)(**(code **)(*(long *)psVar4 + 0x28))(psVar4,pbVar10 + 1,this_00);
      this_00[1].end_ = pbVar10;
      if (this_00->end_ <= pbVar10) {
        pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(this_00,pbVar10);
      }
      uVar6 = uVar8 | 4;
      this_00[1].end_ = pbVar10;
      uVar7 = uVar6;
      if (0x7f < uVar8) {
        do {
          *pbVar10 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar10 = pbVar10 + 1;
          bVar1 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar1);
      }
      *pbVar10 = (byte)uVar6;
      this_00[1].end_ = pbVar10 + 1;
      return;
    }
    uVar8 = *(uint *)(psVar2 + 8);
    pbVar10 = this[1].end_;
    if (this->end_ <= pbVar10) {
      pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar10);
    }
    this[1].end_ = pbVar10;
    uVar7 = uVar8;
    if (0x7f < uVar8) {
      do {
        *pbVar10 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar10 = pbVar10 + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar1);
    }
    *pbVar10 = (byte)uVar8;
    this[1].end_ = pbVar10 + 1;
    puVar3 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                       (this,*(void **)psVar2,*(int *)(psVar2 + 8),pbVar10 + 1);
    this[1].end_ = puVar3;
    return;
  }
  uVar8 = (uint)value->_M_string_length;
  pbVar10 = output->cur_;
  if ((output->impl_).end_ <= pbVar10) {
    pcStack_40 = (code *)0x33c866;
    pbVar10 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar10);
  }
  output->cur_ = pbVar10;
  uVar7 = uVar8;
  if (0x7f < uVar8) {
    do {
      *pbVar10 = (byte)uVar7 | 0x80;
      uVar8 = uVar7 >> 7;
      pbVar10 = pbVar10 + 1;
      bVar1 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar1);
  }
  *pbVar10 = (byte)uVar8;
  pbVar10 = pbVar10 + 1;
  output->cur_ = pbVar10;
  data = (value->_M_dataplus)._M_p;
  uVar8 = (uint)value->_M_string_length;
  if ((long)(output->impl_).end_ - (long)pbVar10 < (long)(int)uVar8) {
    pcStack_40 = (code *)0x33c879;
    pbVar10 = io::EpsCopyOutputStream::WriteRawFallback(&output->impl_,data,uVar8,pbVar10);
  }
  else {
    pcStack_40 = (code *)0x33c7e6;
    memcpy(pbVar10,data,(ulong)uVar8);
    pbVar10 = pbVar10 + (int)uVar8;
  }
  output->cur_ = pbVar10;
  return;
}

Assistant:

void WireFormatLite::WriteBytes(int field_number, const std::string& value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteString(value);
}